

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_queue.hpp
# Opt level: O0

void __thiscall
concurrent_queue<oqpi::task_handle>::push(concurrent_queue<oqpi::task_handle> *this,task_handle *t)

{
  lock_guard<std::mutex> local_20;
  lock_t __l;
  task_handle *t_local;
  concurrent_queue<oqpi::task_handle> *this_local;
  
  __l._M_device = (mutex_type *)t;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  std::queue<oqpi::task_handle,std::deque<oqpi::task_handle,std::allocator<oqpi::task_handle>>>::
  emplace<oqpi::task_handle_const&>
            ((queue<oqpi::task_handle,std::deque<oqpi::task_handle,std::allocator<oqpi::task_handle>>>
              *)&this->queue_,(task_handle *)__l._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void push(const T &t)
    {
        lock_t __l(mutex_);
        queue_.emplace(t);
    }